

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O3

char * nn_print_line(FILE *out,char *str,size_t width)

{
  bool bVar1;
  size_t sVar2;
  ushort **ppuVar3;
  uint uVar4;
  ulong uVar5;
  
  sVar2 = strlen(str);
  if (0x37 < sVar2) {
    ppuVar3 = __ctype_b_loc();
    uVar4 = 0x38;
    do {
      uVar5 = (ulong)uVar4;
      if ((*(byte *)((long)*ppuVar3 + (long)str[uVar5] * 2 + 1) & 0x20) != 0) {
        fprintf((FILE *)out,"%.*s",uVar5,str);
        return str + uVar5 + 1;
      }
      bVar1 = 2 < uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar1);
  }
  fputs(str,(FILE *)out);
  return "";
}

Assistant:

static char *nn_print_line (FILE *out, char *str, size_t width)
{
    int i;
    if (strlen (str) < width) {
        fprintf (out, "%s", str);
        return "";
    }
    for (i = width; i > 1; --i) {
        if (isspace (str[i])) {
            fprintf (out, "%.*s", i, str);
            return str + i + 1;
        }
    }  /* no break points, just print as is */
    fprintf (out, "%s", str);
    return "";
}